

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerTriangles.h
# Opt level: O1

void __thiscall
RayTracerTriangles::RayTracerTriangles(RayTracerTriangles *this,RayTracerConfig *config)

{
  vector<Triangle,_std::allocator<Triangle>_> *triangles;
  float *pfVar1;
  float fVar2;
  float fVar3;
  pointer pTVar4;
  int iVar5;
  Triangle *triangle;
  ostream *poVar6;
  pointer pTVar7;
  KdNode *pKVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  vector<Triangle,_std::allocator<Triangle>_> *__range1;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auStack_48 [8];
  vector<float,_std::allocator<float>_> ranges;
  
  RayTracerBase::RayTracerBase(&this->super_RayTracerBase,config);
  iVar5 = std::thread::hardware_concurrency();
  this->threadNumber = iVar5;
  this->kdTree = (KdNode *)0x0;
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," threads available\n",0x13);
  auStack_48 = (undefined1  [8])0x0;
  ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  triangles = &config->triangles;
  pTVar7 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar7) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)auStack_48,(iterator)0x0,(float *)pTVar7);
    pTVar7 = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_48,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(float *)pTVar7);
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = (pTVar7->x).x;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar9 = &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                super__Vector_impl_data._M_start)->x).y;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_48,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar9);
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar9;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar9 = &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                super__Vector_impl_data._M_start)->x).y;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_48,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar9);
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar9;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar9 = &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                super__Vector_impl_data._M_start)->x).z;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_48,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar9);
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar9;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
    pfVar9 = &(((triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                super__Vector_impl_data._M_start)->x).z;
    if (ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                ((vector<float,std::allocator<float>> *)auStack_48,
                 (iterator)
                 ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,pfVar9);
    }
    else {
      *ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start = *pfVar9;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
    }
  }
  pTVar7 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar7 != pTVar4) {
    fVar16 = *(float *)auStack_48;
    fVar15 = *(float *)((long)auStack_48 + 4);
    fVar14 = *(float *)((long)auStack_48 + 8);
    pfVar9 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
    fVar17 = *(float *)((long)auStack_48 + 0x14);
    fVar18 = *(float *)((long)auStack_48 + 0x10);
    fVar20 = *(float *)((long)auStack_48 + 0xc);
    do {
      fVar2 = (pTVar7->x).x;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar2;
      lVar10 = 4;
      pfVar11 = pfVar9;
      do {
        pfVar12 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar10 + 4);
        if (*pfVar12 <= *pfVar11 && *pfVar11 != *pfVar12) {
          pfVar11 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar10 + 4)
          ;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      fVar21 = (pTVar7->x).y;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar21;
      lVar10 = 4;
      pfVar12 = pfVar9;
      do {
        pfVar1 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + lVar10 + 4);
        if (*pfVar1 <= *pfVar12 && *pfVar12 != *pfVar1) {
          pfVar12 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar10 + 4)
          ;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      fVar3 = *pfVar12;
      fVar13 = (pTVar7->x).z;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar13;
      lVar10 = 4;
      pfVar12 = pfVar9;
      do {
        pfVar1 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + lVar10 + 4);
        if (*pfVar1 <= *pfVar12 && *pfVar12 != *pfVar1) {
          pfVar12 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar10 + 4)
          ;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      fVar19 = *pfVar12;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar2;
      lVar10 = 4;
      pfVar12 = pfVar9;
      do {
        fVar2 = *(float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + lVar10 + 4);
        if (*pfVar12 <= fVar2 && fVar2 != *pfVar12) {
          pfVar12 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar10 + 4)
          ;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      fVar2 = *pfVar12;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar21;
      lVar10 = 4;
      pfVar12 = pfVar9;
      do {
        fVar21 = *(float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar10 + 4);
        if (*pfVar12 <= fVar21 && fVar21 != *pfVar12) {
          pfVar12 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar10 + 4)
          ;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      fVar21 = *pfVar12;
      ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = fVar13;
      lVar10 = 4;
      pfVar12 = pfVar9;
      do {
        fVar13 = *(float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar10 + 4);
        if (*pfVar12 <= fVar13 && fVar13 != *pfVar12) {
          pfVar12 = (float *)((long)&ranges.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + lVar10 + 4)
          ;
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      fVar13 = *pfVar12;
      if (*pfVar12 <= fVar17) {
        fVar13 = fVar17;
      }
      fVar17 = *pfVar11;
      if (fVar16 <= *pfVar11) {
        fVar17 = fVar16;
      }
      fVar16 = fVar17;
      *(float *)auStack_48 = fVar16;
      if (fVar2 <= fVar15) {
        fVar2 = fVar15;
      }
      fVar15 = fVar2;
      *(float *)((long)auStack_48 + 4) = fVar15;
      if (fVar14 <= fVar3) {
        fVar3 = fVar14;
      }
      fVar14 = fVar3;
      *(float *)((long)auStack_48 + 8) = fVar14;
      if (fVar21 <= fVar20) {
        fVar21 = fVar20;
      }
      *(float *)((long)auStack_48 + 0xc) = fVar21;
      if (fVar18 <= fVar19) {
        fVar19 = fVar18;
      }
      *(float *)((long)auStack_48 + 0x10) = fVar19;
      *(float *)((long)auStack_48 + 0x14) = fVar13;
      pTVar7 = pTVar7 + 1;
      fVar17 = fVar13;
      fVar18 = fVar19;
      fVar20 = fVar21;
    } while (pTVar7 != pTVar4);
  }
  pKVar8 = KdNode::build(triangles,(vector<float,_std::allocator<float>_> *)auStack_48,0);
  this->kdTree = pKVar8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"building complete",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)ranges.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

RayTracerTriangles(RayTracerConfig const& config)
    : RayTracerBase(config)
    , threadNumber(std::thread::hardware_concurrency())
  {
    std::cerr << threadNumber << " threads available\n";
    std::vector<float> ranges;
    if(config.triangles.size() > 0)
    {
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.x);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.y);
      ranges.push_back(config.triangles[0].x.z);
      ranges.push_back(config.triangles[0].x.z);
    }
    for(auto const& triangle : config.triangles)
    {
      Point pMin = getMinPoint(triangle);
      Point pMax = getMaxPoint(triangle);

       ranges[0] = std::min(ranges[0], pMin.x); 
       ranges[1] = std::max(ranges[1], pMax.x); 
       ranges[2] = std::min(ranges[2], pMin.y); 
       ranges[3] = std::max(ranges[3], pMax.y); 
       ranges[4] = std::min(ranges[4], pMin.z); 
       ranges[5] = std::max(ranges[5], pMax.z); 
    }
    kdTree = KdNode::build(const_cast<RayTracerConfig&>(config).triangles, ranges, 0);
    std::cerr << "building complete" << std::endl;
  }